

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_Declarations.cpp
# Opt level: O0

bool __thiscall
psy::C::Parser::parseDirectDeclaratorSuffix
          (Parser *this,DeclaratorSyntax **decltor,DeclarationContext declCtx,
          DeclaratorForm decltorForm,SpecifierListSyntax *attrList,DeclaratorSyntax *innerDecltor)

{
  SubscriptSuffixSyntax *pSVar1;
  ParameterSuffixSyntax *pPVar2;
  bool bVar3;
  SyntaxKind SVar4;
  int iVar5;
  SyntaxToken *pSVar6;
  IndexType IVar7;
  ArrayOrFunctionDeclaratorSyntax *pAVar8;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  SyntaxNodePlainList<psy::C::SpecifierSyntax_*> *pSVar9;
  SpecifierSyntax *local_c0;
  SpecifierSyntax *spec;
  SpecifierListSyntax **specList_cur;
  ArrayOrFunctionDeclaratorSyntax *arrayOrFuncDecltor;
  code *local_a0;
  undefined8 local_98;
  SyntaxKind local_8a;
  code *pcStack_88;
  SyntaxKind tkK;
  undefined8 local_80;
  code *local_78;
  undefined8 local_70;
  SubscriptSuffixSyntax *local_68;
  SubscriptSuffixSyntax *arrDecltorSx;
  ParameterSuffixSyntax *local_58;
  ParameterSuffixSyntax *funcDecltorSfx;
  anon_class_8_1_8991fb9c checkDialect;
  anon_class_16_2_2a18f7ca validateContext;
  DeclaratorSyntax *innerDecltor_local;
  SpecifierListSyntax *attrList_local;
  DeclaratorForm decltorForm_local;
  DeclarationContext declCtx_local;
  DeclaratorSyntax **decltor_local;
  Parser *this_local;
  
  funcDecltorSfx = (ParameterSuffixSyntax *)this;
  checkDialect.this = this;
  pSVar6 = peek(this,1);
  SVar4 = SyntaxToken::kind(pSVar6);
  if (SVar4 == OpenBracketToken) {
    local_68 = makeNode<psy::C::SubscriptSuffixSyntax>(this);
    IVar7 = consume(this);
    local_68->openBracketTkIdx_ = IVar7;
    pSVar6 = peek(this,1);
    SVar4 = SyntaxToken::kind(pSVar6);
    if (SVar4 != CloseBracketToken) {
      if ((SVar4 == KeywordAlias___const) || (SVar4 == KeywordAlias___restrict)) {
LAB_004089cf:
        parseDirectDeclaratorSuffix::anon_class_8_1_8991fb9c::operator()
                  ((anon_class_8_1_8991fb9c *)&funcDecltorSfx);
        pcStack_88 = DiagnosticsReporter::UnexpectedStaticOrTypeQualifiersInArrayDeclarator;
        local_80 = 0;
        bVar3 = parseDirectDeclaratorSuffix::anon_class_16_2_2a18f7ca::operator()
                          ((anon_class_16_2_2a18f7ca *)&checkDialect,0x3eb910);
        if ((!bVar3) ||
           (bVar3 = parseTypeQualifiersAndAttributes(this,&local_68->qualsAndAttrs1_), !bVar3)) {
          skipTo(this,CloseBracketToken);
          return false;
        }
        pSVar6 = peek(this,1);
        local_8a = SyntaxToken::kind(pSVar6);
        if (local_8a == AsteriskToken) {
          IVar7 = consume(this);
          local_68->asteriskTkIdx_ = IVar7;
        }
        else {
          if (local_8a == Keyword_static) goto LAB_00408abf;
          bVar3 = parseExpressionWithPrecedenceAssignment(this,&local_68->expr_);
          if (!bVar3) {
            skipTo(this,CloseBracketToken);
            return false;
          }
        }
      }
      else {
        if (SVar4 == Keyword_static) {
LAB_00408abf:
          parseDirectDeclaratorSuffix::anon_class_8_1_8991fb9c::operator()
                    ((anon_class_8_1_8991fb9c *)&funcDecltorSfx);
          local_a0 = DiagnosticsReporter::UnexpectedStaticOrTypeQualifiersInArrayDeclarator;
          local_98 = 0;
          bVar3 = parseDirectDeclaratorSuffix::anon_class_16_2_2a18f7ca::operator()
                            ((anon_class_16_2_2a18f7ca *)&checkDialect,0x3eb910);
          if (!bVar3) {
            skipTo(this,CloseBracketToken);
            return false;
          }
          IVar7 = consume(this);
          local_68->staticKwTkIdx_ = IVar7;
          pSVar6 = peek(this,1);
          SVar4 = SyntaxToken::kind(pSVar6);
          if (((((SVar4 == KeywordAlias___const) || (SVar4 == KeywordAlias___restrict)) ||
               (SVar4 == ENDof_KeywordOrPunctuatorToken)) || (SVar4 == KeywordAlias___attribute)) &&
             (bVar3 = parseTypeQualifiersAndAttributes(this,&local_68->qualsAndAttrs2_), !bVar3)) {
            skipTo(this,CloseBracketToken);
            return false;
          }
        }
        else {
          if (SVar4 == ENDof_KeywordOrPunctuatorToken) goto LAB_004089cf;
          if (SVar4 == AsteriskToken) {
            parseDirectDeclaratorSuffix::anon_class_8_1_8991fb9c::operator()
                      ((anon_class_8_1_8991fb9c *)&funcDecltorSfx);
            local_78 = DiagnosticsReporter::UnexpectedPointerInArrayDeclarator;
            local_70 = 0;
            bVar3 = parseDirectDeclaratorSuffix::anon_class_16_2_2a18f7ca::operator()
                              ((anon_class_16_2_2a18f7ca *)&checkDialect,0x3ebad0);
            if (!bVar3) {
              skipTo(this,CloseBracketToken);
              return false;
            }
            IVar7 = consume(this);
            local_68->asteriskTkIdx_ = IVar7;
            goto LAB_00408bf1;
          }
          if ((SVar4 == Keyword__Atomic) || (SVar4 == KeywordAlias___attribute)) goto LAB_004089cf;
        }
        bVar3 = parseExpressionWithPrecedenceAssignment(this,&local_68->expr_);
        if (!bVar3) {
          skipTo(this,CloseBracketToken);
          return false;
        }
      }
    }
LAB_00408bf1:
    bVar3 = matchOrSkipTo(this,CloseBracketToken,&local_68->closeBracketTkIdx_);
    if (!bVar3) {
      return false;
    }
    arrayOrFuncDecltor._6_2_ = 0x415;
    pAVar8 = makeNode<psy::C::ArrayOrFunctionDeclaratorSyntax,psy::C::SyntaxKind>
                       (this,(SyntaxKind *)((long)&arrayOrFuncDecltor + 6));
    pSVar1 = local_68;
    *decltor = &pAVar8->super_DeclaratorSyntax;
    iVar5 = (*((*decltor)->super_SyntaxNode).super_Managed._vptr_Managed[0x56])();
    *(SubscriptSuffixSyntax **)(CONCAT44(extraout_var_00,iVar5) + 0x28) = pSVar1;
  }
  else {
    if (SVar4 != OpenParenToken) {
      return true;
    }
    local_58 = makeNode<psy::C::ParameterSuffixSyntax>(this);
    IVar7 = consume(this);
    local_58->openParenTkIdx_ = IVar7;
    bVar3 = parseParameterDeclarationListAndOrEllipsis(this,&local_58);
    if ((!bVar3) || (bVar3 = match(this,CloseParenToken,&local_58->closeParenTkIdx_), !bVar3)) {
      return false;
    }
    pSVar6 = peek(this,1);
    SVar4 = SyntaxToken::kind(pSVar6);
    if (SVar4 == Keyword_ExtPSY_omission) {
      IVar7 = consume(this);
      local_58->psyOmitTkIdx_ = IVar7;
    }
    arrDecltorSx._6_2_ = 0x416;
    pAVar8 = makeNode<psy::C::ArrayOrFunctionDeclaratorSyntax,psy::C::SyntaxKind>
                       (this,(SyntaxKind *)((long)&arrDecltorSx + 6));
    pPVar2 = local_58;
    *decltor = &pAVar8->super_DeclaratorSyntax;
    iVar5 = (*((*decltor)->super_SyntaxNode).super_Managed._vptr_Managed[0x56])();
    *(ParameterSuffixSyntax **)(CONCAT44(extraout_var,iVar5) + 0x28) = pPVar2;
  }
  specList_cur = (SpecifierListSyntax **)*decltor;
  (((DeclaratorSyntax *)((long)specList_cur + 0x18))->super_SyntaxNode).super_Managed._vptr_Managed
       = (_func_int **)attrList;
  (((DeclaratorSyntax *)((long)specList_cur + 0x18))->super_SyntaxNode).tree_ =
       (SyntaxTree *)innerDecltor;
  spec = (SpecifierSyntax *)((long)specList_cur + 0x30);
  pSVar6 = peek(this,1);
  SVar4 = SyntaxToken::kind(pSVar6);
  if (SVar4 != KeywordAlias___attribute) {
    if (SVar4 != KeywordAlias___asm) goto LAB_00408d96;
    local_c0 = (SpecifierSyntax *)0x0;
    bVar3 = parseExtGNU_AsmLabel_AtFirst(this,&local_c0);
    if (!bVar3) {
      return false;
    }
    pSVar9 = makeNode<psy::C::SyntaxNodePlainList<psy::C::SpecifierSyntax*>,psy::C::SpecifierSyntax*&>
                       (this,&local_c0);
    (spec->super_SyntaxNode).super_Managed._vptr_Managed = (_func_int **)pSVar9;
    spec = (SpecifierSyntax *)((spec->super_SyntaxNode).super_Managed._vptr_Managed + 2);
    pSVar6 = peek(this,1);
    SVar4 = SyntaxToken::kind(pSVar6);
    if (SVar4 != KeywordAlias___attribute) goto LAB_00408d96;
  }
  bVar3 = parseExtGNU_AttributeSpecifierList_AtFirst(this,(SpecifierListSyntax **)spec);
  if (!bVar3) {
    return false;
  }
LAB_00408d96:
  pSVar6 = peek(this,1);
  SVar4 = SyntaxToken::kind(pSVar6);
  if ((SVar4 == OpenBracketToken) || (SVar4 == OpenParenToken)) {
    this_local._7_1_ =
         parseDirectDeclaratorSuffix
                   (this,decltor,declCtx,decltorForm,(SpecifierListSyntax *)0x0,*decltor);
  }
  else {
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool Parser::parseDirectDeclaratorSuffix(DeclaratorSyntax*& decltor,
                                         DeclarationContext declCtx,
                                         DeclaratorForm decltorForm,
                                         SpecifierListSyntax* attrList,
                                         DeclaratorSyntax* innerDecltor)
{
    auto validateContext =
            [this, declCtx] (void (Parser::DiagnosticsReporter::*report)()) {
                if (declCtx != DeclarationContext::Parameter) {
                    ((diagReporter_).*(report))();
                    skipTo(SyntaxKind::CloseBracketToken);
                    return false;
                }
                return true;
            };

    auto checkDialect =
            [this] () {
                if (tree_->dialect().std() < LanguageDialect::Std::C99) {
                    diagReporter_.ExpectedFeature(
                            "C99 array declarators with `*', `static', and type-qualifiers "
                            "within function parameters");
                }
            };

    switch (peek().kind()) {
        case SyntaxKind::OpenParenToken: {
            auto funcDecltorSfx = makeNode<ParameterSuffixSyntax>();
            funcDecltorSfx->openParenTkIdx_ = consume();
            if (!parseParameterDeclarationListAndOrEllipsis(funcDecltorSfx)
                    || !match(SyntaxKind::CloseParenToken, &funcDecltorSfx->closeParenTkIdx_))
                return false;

            if (peek().kind() == SyntaxKind::Keyword_ExtPSY_omission)
                funcDecltorSfx->psyOmitTkIdx_ = consume();

            decltor = makeNode<ArrayOrFunctionDeclaratorSyntax>(SyntaxKind::FunctionDeclarator);
            decltor->asArrayOrFunctionDeclarator()->suffix_ = funcDecltorSfx;
            break;
        }

        case SyntaxKind::OpenBracketToken: {
            auto arrDecltorSx = makeNode<SubscriptSuffixSyntax>();
            arrDecltorSx->openBracketTkIdx_ = consume();
            switch (peek().kind()) {
                case SyntaxKind::CloseBracketToken:
                    break;

                case SyntaxKind::AsteriskToken:
                    checkDialect();
                    if (!validateContext(&Parser::DiagnosticsReporter::
                                         UnexpectedPointerInArrayDeclarator)) {
                        skipTo(SyntaxKind::CloseBracketToken);
                        return false;
                    }
                    arrDecltorSx->asteriskTkIdx_ = consume();
                    break;

                case SyntaxKind::Keyword_const:
                case SyntaxKind::Keyword_volatile:
                case SyntaxKind::Keyword_restrict:
                case SyntaxKind::Keyword__Atomic:
                case SyntaxKind::Keyword_ExtGNU___attribute__: {
                    checkDialect();
                    if (!validateContext(&Parser::DiagnosticsReporter::
                                         UnexpectedStaticOrTypeQualifiersInArrayDeclarator)
                            || !parseTypeQualifiersAndAttributes(arrDecltorSx->qualsAndAttrs1_)) {
                        skipTo(SyntaxKind::CloseBracketToken);
                        return false;
                    }

                    auto tkK = peek().kind();
                    if (tkK == SyntaxKind::AsteriskToken) {
                        arrDecltorSx->asteriskTkIdx_ = consume();
                        break;
                    }
                    else if (tkK != SyntaxKind::Keyword_static) {
                        if (!parseExpressionWithPrecedenceAssignment(arrDecltorSx->expr_)) {
                            skipTo(SyntaxKind::CloseBracketToken);
                            return false;
                        }
                        break;
                    }
                    [[fallthrough]];
                }

                case SyntaxKind::Keyword_static:
                    checkDialect();
                    if (!validateContext(&Parser::DiagnosticsReporter::
                                         UnexpectedStaticOrTypeQualifiersInArrayDeclarator)) {
                        skipTo(SyntaxKind::CloseBracketToken);
                        return false;
                    }

                    arrDecltorSx->staticKwTkIdx_ = consume();
                    switch (peek().kind()) {
                        case SyntaxKind::Keyword_const:
                        case SyntaxKind::Keyword_volatile:
                        case SyntaxKind::Keyword_restrict:
                        case SyntaxKind::Keyword_ExtGNU___attribute__:
                            if (!parseTypeQualifiersAndAttributes(arrDecltorSx->qualsAndAttrs2_)) {
                                skipTo(SyntaxKind::CloseBracketToken);
                                return false;
                            }
                            [[fallthrough]];

                        default:
                            break;
                    }
                    [[fallthrough]];

                default:
                    if (!parseExpressionWithPrecedenceAssignment(arrDecltorSx->expr_)) {
                        skipTo(SyntaxKind::CloseBracketToken);
                        return false;
                    }
                    break;
            }

            if (!matchOrSkipTo(SyntaxKind::CloseBracketToken, &arrDecltorSx->closeBracketTkIdx_))
                return false;

            decltor = makeNode<ArrayOrFunctionDeclaratorSyntax>(SyntaxKind::ArrayDeclarator);
            decltor->asArrayOrFunctionDeclarator()->suffix_ = arrDecltorSx;
            break;
        }

        default:
            return true;
    }

    auto arrayOrFuncDecltor = static_cast<ArrayOrFunctionDeclaratorSyntax*>(decltor);
    arrayOrFuncDecltor->attrs1_ = attrList;
    arrayOrFuncDecltor->innerDecltor_ = innerDecltor;

    SpecifierListSyntax** specList_cur = &arrayOrFuncDecltor->attrs2_;

    switch (peek().kind()) {
        case SyntaxKind::Keyword_ExtGNU___asm__: {
            SpecifierSyntax* spec = nullptr;
            if (!parseExtGNU_AsmLabel_AtFirst(spec))
                return false;

            *specList_cur = makeNode<SpecifierListSyntax>(spec);
            specList_cur = &(*specList_cur)->next;

            if (peek().kind() != SyntaxKind::Keyword_ExtGNU___attribute__)
                break;
            [[fallthrough]];
        }

        case SyntaxKind::Keyword_ExtGNU___attribute__:
            if (!parseExtGNU_AttributeSpecifierList_AtFirst(*specList_cur))
                return false;
            break;

        default:
            break;
    }

    switch (peek().kind()) {
        case SyntaxKind::OpenParenToken:
        case SyntaxKind::OpenBracketToken: {
            innerDecltor = decltor;
            return parseDirectDeclaratorSuffix(decltor,
                                               declCtx,
                                               decltorForm,
                                               nullptr,
                                               innerDecltor);
        }

        default:
            return true;
    }

    return true;
}